

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battlewithlandlord.cc
# Opt level: O1

void __thiscall
BattleWithLandlord::Move
          (BattleWithLandlord *this,multiset<char,_std::less<char>,_std::allocator<char>_> *pattern)

{
  undefined1 uVar1;
  undefined1 uVar2;
  int iVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  const_iterator __position;
  
  if ((pattern->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    for (p_Var5 = (pattern->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &(pattern->_M_t)._M_impl.super__Rb_tree_header;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      uVar1 = (undefined1)((_Rb_tree_node_base *)((long)p_Var5 + 0x20))->_M_color;
      iVar3 = this->_side;
      __position._M_node = &this->_cards[iVar3]._M_t._M_impl.super__Rb_tree_header._M_header;
      p_Var6 = __position._M_node;
      for (p_Var4 = this->_cards[iVar3]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[(char)uVar2 < (char)uVar1]) {
        uVar2 = (undefined1)p_Var4[1]._M_color;
        if ((char)uVar1 <= (char)uVar2) {
          p_Var6 = p_Var4;
        }
      }
      if ((p_Var6 != __position._M_node) && ((char)p_Var6[1]._M_color <= (char)uVar1)) {
        __position._M_node = p_Var6;
      }
      std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
      erase_abi_cxx11_((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                        *)(this->_cards + iVar3),__position);
    }
  }
  this->_side = 1 - this->_side;
  this->_round = this->_round + 1;
  return;
}

Assistant:

void BattleWithLandlord::Move(const multiset<byte> &pattern) {
    if (pattern.size()) {
        for (auto x: pattern) {
            _cards[_side].erase(_cards[_side].find(x));
        }
    }
    _side = 1 - _side;
    ++_round;
}